

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O1

Matrix<float,_4,_2> * __thiscall
deqp::gles3::Functional::MatrixCaseUtils::outerProduct<float,2,4>
          (Matrix<float,_4,_2> *__return_storage_ptr__,MatrixCaseUtils *this,Vector<float,_4> *a,
          Vector<float,_2> *b)

{
  float fVar1;
  Vector<float,_4> *pVVar2;
  Matrix<float,_4,_2> *pMVar3;
  long lVar4;
  float *pfVar5;
  long lVar6;
  int col;
  long lVar7;
  bool bVar8;
  undefined4 uVar9;
  Matrix<float,_2,_4> retVal;
  
  pMVar3 = __return_storage_ptr__;
  pfVar5 = (float *)&retVal;
  retVal.m_data.m_data[2].m_data[0] = 0.0;
  retVal.m_data.m_data[2].m_data[1] = 0.0;
  retVal.m_data.m_data[3].m_data[0] = 0.0;
  retVal.m_data.m_data[3].m_data[1] = 0.0;
  retVal.m_data.m_data[0].m_data[0] = 0.0;
  retVal.m_data.m_data[0].m_data[1] = 0.0;
  retVal.m_data.m_data[1].m_data[0] = 0.0;
  retVal.m_data.m_data[1].m_data[1] = 0.0;
  lVar4 = 0;
  do {
    lVar7 = 0;
    do {
      uVar9 = 0x3f800000;
      if (lVar4 != lVar7) {
        uVar9 = 0;
      }
      pfVar5[lVar7 * 2] = (float)uVar9;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    pfVar5 = pfVar5 + 1;
    bVar8 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar8);
  pfVar5 = (float *)&retVal;
  lVar4 = 0;
  do {
    fVar1 = a->m_data[lVar4];
    lVar7 = 0;
    do {
      pfVar5[lVar7 * 2] = *(float *)(this + lVar7 * 4) * fVar1;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    pfVar5 = pfVar5 + 1;
    bVar8 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar8);
  (__return_storage_ptr__->m_data).m_data[1].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1] = 0.0;
  pVVar2 = (__return_storage_ptr__->m_data).m_data;
  pVVar2[1].m_data[2] = 0.0;
  pVVar2[1].m_data[3] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[2] = 0.0;
  (__return_storage_ptr__->m_data).m_data[0].m_data[3] = 0.0;
  lVar4 = 0;
  lVar7 = 0;
  pfVar5 = (float *)__return_storage_ptr__;
  do {
    lVar6 = 0;
    do {
      uVar9 = 0x3f800000;
      if (lVar4 != lVar6) {
        uVar9 = 0;
      }
      *(undefined4 *)((long)pfVar5 + lVar6) = uVar9;
      lVar6 = lVar6 + 0x10;
    } while (lVar6 == 0x10);
    lVar7 = lVar7 + 1;
    pfVar5 = pfVar5 + 1;
    lVar4 = lVar4 + 0x10;
  } while (lVar7 != 4);
  pfVar5 = (float *)&retVal;
  lVar4 = 0;
  do {
    lVar7 = 0;
    do {
      ((Vector<tcu::Vector<float,_4>,_2> *)((Vector<float,_4> *)__return_storage_ptr__)->m_data)->
      m_data[0].m_data[lVar7] = pfVar5[lVar7 * 2];
      lVar7 = lVar7 + 1;
    } while (lVar7 != 4);
    __return_storage_ptr__ = (Matrix<float,_4,_2> *)((long)__return_storage_ptr__ + 0x10);
    pfVar5 = pfVar5 + 1;
    bVar8 = lVar4 == 0;
    lVar4 = lVar4 + 1;
  } while (bVar8);
  return pMVar3;
}

Assistant:

tcu::Matrix<T, Cols, Rows> outerProduct (const tcu::Vector<T, Cols>& a, const tcu::Vector<T, Rows>& b)
{
	tcu::Matrix<T, Rows, Cols> retVal;

	for (int r = 0; r < Rows; ++r)
		for (int c = 0; c < Cols; ++c)
			retVal(r,c) = a[c] * b[r];

	return transpose(retVal); // to gl-form (column-major)
}